

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

void ConvexDecomposition::checkit(cbtHullTriangle *t)

{
  long lVar1;
  int b;
  int a;
  cbtHullTriangle **ppcVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  
  ppcVar2 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                      ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,t->id);
  if (*ppcVar2 != t) {
    __assert_fail("tris[t->id]==t",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x960,"void ConvexDecomposition::checkit(cbtHullTriangle *)");
  }
  lVar6 = -0x100000000;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 3) {
      return;
    }
    lVar1 = lVar3 + 1;
    lVar5 = 0;
    if (lVar1 != 3) {
      lVar5 = lVar1;
    }
    b = (&(t->super_int3).x)[lVar5];
    lVar5 = lVar6 >> 0x20;
    if (lVar1 == 1) {
      lVar5 = 2;
    }
    a = (&(t->super_int3).x)[lVar5];
    if (b == a) break;
    ppcVar2 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                        ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,(&(t->n).x)[lVar3]);
    piVar4 = cbtHullTriangle::neib(*ppcVar2,a,b);
    lVar6 = lVar6 + 0x100000000;
    lVar3 = lVar1;
    if (*piVar4 != t->id) {
      __assert_fail("tris[t->n[i]]->neib(b,a) == t->id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x968,"void ConvexDecomposition::checkit(cbtHullTriangle *)");
    }
  }
  __assert_fail("a!=b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x967,"void ConvexDecomposition::checkit(cbtHullTriangle *)");
}

Assistant:

void checkit(cbtHullTriangle *t)
{
	int i;
	assert(tris[t->id]==t);
	for(i=0;i<3;i++)
	{
		int i1=(i+1)%3;
		int i2=(i+2)%3;
		int a = (*t)[i1];
		int b = (*t)[i2];
		assert(a!=b);
		assert( tris[t->n[i]]->neib(b,a) == t->id);
	}
}